

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1e0;
  int running;
  int maxfd;
  double local_1d0;
  double connect_time;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  connect_time = 0.0;
  running = 1;
  local_1d0 = 1.0;
  do {
    local_1d0 = local_1d0 * 0.5;
  } while (1.0 < local_1d0 * 0.5 + 1.0);
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                  ,0x33,iVar1,uVar2);
    goto LAB_0010253d;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar7 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                  ,0x35);
    iVar1 = 0x7c;
    goto LAB_0010251d;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2a,1);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1e0 = 0x38;
      goto LAB_0010250c;
    }
    libtest_debug_config.tracetime = 1;
    libtest_debug_config.nohex = 1;
    iVar1 = curl_easy_setopt(lVar3,0x276f);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1e0 = 0x3c;
      goto LAB_0010250c;
    }
    iVar1 = curl_easy_setopt(lVar3,0x4e7e,libtest_debug_cb);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1e0 = 0x3d;
      goto LAB_0010250c;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1e0 = 0x3e;
      goto LAB_0010250c;
    }
    lVar7 = curl_multi_init();
    if (lVar7 == 0) {
      lVar7 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                    ,0x40);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar7,lVar3);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar6 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1e0 = 0x42;
        goto LAB_0010250c;
      }
      iVar1 = 1;
      do {
        if (iVar1 == 0) {
LAB_00102707:
          iVar1 = 0;
          curl_easy_getinfo(lVar3,0x300005,&connect_time);
          if (connect_time < local_1d0) {
            curl_mfprintf(_stderr,"connect time %e is < epsilon %e\n");
            iVar1 = 0x7e;
          }
          goto LAB_0010251d;
        }
        maxfd = -99;
        timeout.tv_sec = 0;
        timeout.tv_usec = 100000;
        iVar1 = curl_multi_perform(lVar7,&running);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar6 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1e0 = 0x4c;
          goto LAB_0010250c;
        }
        if (running < 0) {
          pcVar6 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1e0 = 0x4c;
LAB_001027f9:
          curl_mfprintf(_stderr,pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                        ,uStack_1e0);
          iVar1 = 0x7a;
          goto LAB_0010251d;
        }
        tVar9 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar9,tv_test_start);
        if (60000 < lVar4) {
          uStack_1e0 = 0x4e;
          goto LAB_00102862;
        }
        if (running == 0) goto LAB_00102707;
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdread.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdwrite.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          fdexcep.__fds_bits[lVar4] = 0;
        }
        iVar1 = curl_multi_fdset(lVar7,&fdread,&fdwrite,&fdexcep,&maxfd);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar6 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1e0 = 0x57;
          goto LAB_0010250c;
        }
        if (maxfd < -1) {
          pcVar6 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1e0 = 0x57;
          goto LAB_001027f9;
        }
        iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          uVar8 = _stderr;
          iVar1 = *piVar5;
          pcVar6 = strerror(iVar1);
          curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                        ,0x5b,iVar1,pcVar6);
          iVar1 = 0x79;
          goto LAB_0010251d;
        }
        tVar9 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar9,tv_test_start);
        iVar1 = running;
      } while (lVar4 < 0xea61);
      uStack_1e0 = 0x5d;
LAB_00102862:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                    ,uStack_1e0);
      iVar1 = 0x7d;
    }
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar7 = 0;
    uStack_1e0 = 0x37;
LAB_0010250c:
    curl_mfprintf(uVar8,pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib573.c"
                  ,uStack_1e0,iVar1,uVar2);
  }
LAB_0010251d:
  curl_multi_remove_handle(lVar7,lVar3);
  curl_multi_cleanup(lVar7);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010253d:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while(running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if(connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time %e is < epsilon %e\n",
            connect_time, dbl_epsilon);
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}